

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsModuleCompiler::SetupLocalVariables(AsmJsModuleCompiler *this,AsmJsFunc *func)

{
  double dVar1;
  uint i;
  ParseNode *this_00;
  code *pcVar2;
  OpCode OVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  Which WVar7;
  int iVar8;
  RegSlot RVar9;
  undefined4 *puVar10;
  ParseNodeVar *pPVar11;
  AsmJsFunc *name;
  AsmJsSymbol *sym;
  AsmJsFunctionDeclaration *sym_00;
  IdentPtr pIVar12;
  AsmJsVarBase *pAVar13;
  ParseNodeInt *pPVar14;
  ParseNodeFloat *pPVar15;
  ParseNodeCall *pPVar16;
  AsmJsMathConst *pAVar17;
  AsmJsVar *pAVar18;
  ParseNode *pPVar19;
  ParseNode *node;
  char16_t *pcVar20;
  bool bVar21;
  undefined4 uVar22;
  undefined1 auStack_88 [8];
  BVSparse<Memory::ArenaAllocator> initializerBV;
  ParseNode *local_58;
  AsmJsType local_34;
  
  node = func->mBodyNode;
  initializerBV.alloc = (Type)auStack_88;
  auStack_88 = (undefined1  [8])0x0;
  initializerBV.head = (Type)0x0;
  name = func;
  initializerBV.lastFoundIndex = (Type)this;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (; bVar21 = true, node->nop == knopList; node = ParserWrapper::GetBinaryRight(node)) {
    local_58 = ParserWrapper::GetBinaryLeft(node);
    while (pPVar19 = local_58, local_58 != (ParseNode *)0x0) {
      OVar3 = local_58->nop;
      if (OVar3 == knopList) {
        pPVar19 = ParserWrapper::GetBinaryLeft(local_58);
        local_58 = ParserWrapper::GetBinaryRight(local_58);
        OVar3 = pPVar19->nop;
      }
      else {
        if (OVar3 == knopEndCode) break;
        local_58 = (ParseNode *)0x0;
      }
      bVar21 = OVar3 != knopVarDecl;
      if (bVar21) goto LAB_00872c15;
      pPVar11 = ParseNode::AsParseNodeVar(pPVar19);
      this_00 = pPVar11->pnodeInit;
      if (this_00 == (ParseNode *)0x0) {
        pcVar20 = L"The righthand side of a var declaration missing an initialization (empty)";
LAB_00872bca:
        Fail(this,(ParseNode *)name,pcVar20);
        goto LAB_00872c12;
      }
      OVar3 = this_00->nop;
      if (OVar3 == knopCall) {
        pPVar16 = ParseNode::AsParseNodeCall(this_00);
        if (pPVar16->pnodeTarget->nop != knopName) {
LAB_00872bc3:
          pcVar20 = L"Var declaration with something else than a literal value|fround call";
          goto LAB_00872bca;
        }
        pPVar16 = ParseNode::AsParseNodeCall(this_00);
        pIVar12 = ParseNode::name(pPVar16->pnodeTarget);
        sym_00 = LookupIdentifier<Js::AsmJsFunctionDeclaration>(this,pIVar12);
        if (sym_00 == (AsmJsFunctionDeclaration *)0x0) {
          pcVar20 = L"Cannot resolve function name";
        }
        else {
          if ((sym_00->super_AsmJsSymbol).mType != MathBuiltinFunction) {
            Fail(this,(ParseNode *)pIVar12,L"Unknown function call on var declaration");
            goto LAB_00872c12;
          }
          bVar4 = AsmJsMathFunction::IsFround(sym_00);
          if (bVar4) {
            pPVar16 = ParseNode::AsParseNodeCall(this_00);
            bVar4 = ParserWrapper::IsFroundNumericLiteral(pPVar16->pnodeArgs);
            if (bVar4) {
              bVar4 = true;
              sym = (AsmJsSymbol *)0x0;
              goto LAB_00872683;
            }
          }
          pcVar20 = L"Var declaration with something else than a literal value|fround call";
        }
        Fail(this,(ParseNode *)pIVar12,pcVar20);
        goto LAB_00872c12;
      }
      sym = (AsmJsSymbol *)0x0;
      bVar4 = false;
      if ((OVar3 != knopInt) && (bVar4 = false, OVar3 != knopFlt)) {
        if (OVar3 != knopName) goto LAB_00872bc3;
        name = (AsmJsFunc *)ParseNode::name(this_00);
        sym = LookupIdentifier(this,(PropertyName)name,func,(Source *)0x0);
        if (((sym == (AsmJsSymbol *)0x0) || ((sym->mType & ~MathConstant) != Variable)) ||
           (iVar8 = (*sym->_vptr_AsmJsSymbol[1])(sym), (char)iVar8 != '\0')) {
          pcVar20 = L"Var declaration with non-constant";
          goto LAB_00872bca;
        }
        bVar4 = false;
      }
LAB_00872683:
      pIVar12 = ParseNode::name(pPVar19);
      bVar5 = AsmJSCompiler::CheckIdentifier(this,pPVar19,pIVar12);
      if (!bVar5) goto LAB_00872c15;
      name = (AsmJsFunc *)ParseNode::name(pPVar19);
      pAVar13 = AsmJsFunc::DefineVar(func,(PropertyName)name,false,true);
      if (pAVar13 == (AsmJsVarBase *)0x0) {
        pcVar20 = L"Failed to define var";
LAB_00872baf:
        Fail(this,(ParseNode *)name,pcVar20);
        goto LAB_00872c12;
      }
      i = ((pAVar13->super_AsmJsSymbol).mName)->m_propertyId;
      name = (AsmJsFunc *)(ulong)i;
      BVar6 = BVSparse<Memory::ArenaAllocator>::Test
                        ((BVSparse<Memory::ArenaAllocator> *)auStack_88,i);
      if (BVar6 != '\0') {
        pcVar20 = L"Cannot declare a var after using it in an initializer";
        goto LAB_00872baf;
      }
      if (this_00->nop != knopInt) {
        bVar21 = ParserWrapper::IsMinInt(this_00);
        if (bVar21) {
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
          (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
          RVar9 = AsmJsFunc::AcquireRegister<int>(func);
          pAVar13->mLocation = RVar9;
          *(undefined4 *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 0x80000000;
          name = (AsmJsFunc *)0x80000000;
          goto LAB_008727a9;
        }
        bVar21 = ParserWrapper::IsUnsigned(this_00);
        if (bVar21) {
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
          (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
          RVar9 = AsmJsFunc::AcquireRegister<int>(func);
          pAVar13->mLocation = RVar9;
          pPVar15 = ParseNode::AsParseNodeFloat(this_00);
          *(int *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (int)(long)pPVar15->dbl;
          pPVar15 = ParseNode::AsParseNodeFloat(this_00);
          name = (AsmJsFunc *)(long)pPVar15->dbl;
          goto LAB_008727a9;
        }
        OVar3 = this_00->nop;
        if (OVar3 == knopName) {
          if ((sym == (AsmJsSymbol *)0x0) || (sym->mType != Variable)) {
            local_34.which_ = (**sym->_vptr_AsmJsSymbol)(sym);
            bVar21 = AsmJsType::operator==(&local_34,(AsmJsType)0x2);
            if (!bVar21) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar10 = 1;
              bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                           ,0x395,"(declSym->GetType() == AsmJsType::Double)",
                                           "declSym->GetType() == AsmJsType::Double");
              if (!bVar21) goto LAB_00872c39;
              *puVar10 = 0;
            }
            pAVar17 = AsmJsMathConst::FromSymbol(sym);
            name = (AsmJsFunc *)0x2;
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
            (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
            RVar9 = AsmJsFunc::AcquireRegister<double>(func);
            pAVar13->mLocation = RVar9;
            iVar8 = SUB84(*pAVar17->mVal,0);
            uVar22 = (undefined4)((ulong)*pAVar17->mVal >> 0x20);
LAB_00872956:
            pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (_func_int **)CONCAT44(uVar22,iVar8);
          }
          else {
            pAVar18 = AsmJsVar::FromSymbol(sym);
            BVSparse<Memory::ArenaAllocator>::Set
                      ((BVSparse<Memory::ArenaAllocator> *)auStack_88,
                       ((pAVar18->super_AsmJsVarBase).super_AsmJsSymbol.mName)->m_propertyId);
            local_34.which_._0_1_ = (pAVar18->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
            WVar7 = AsmJsVarType::which((AsmJsVarType *)&local_34);
            if (WVar7 == Int) {
              name = (AsmJsFunc *)0x0;
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
              (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
              RVar9 = AsmJsFunc::AcquireRegister<int>(func);
              pAVar13->mLocation = RVar9;
              *(float *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                   (pAVar18->mConstInitialiser).floatVal;
            }
            else {
              if (WVar7 == Double) {
                name = (AsmJsFunc *)0x2;
                AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
                (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                RVar9 = AsmJsFunc::AcquireRegister<double>(func);
                pAVar13->mLocation = RVar9;
                iVar8 = (pAVar18->mConstInitialiser).intVal;
                uVar22 = SUB84(pAVar18->mConstInitialiser,4);
                goto LAB_00872956;
              }
              if (WVar7 != Float) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar10 = 1;
                name = (AsmJsFunc *)0x390;
                bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                             ,0x390,"((0))","(0)");
                goto LAB_00872998;
              }
              name = (AsmJsFunc *)0x3;
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
              (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
              RVar9 = AsmJsFunc::AcquireRegister<float>(func);
              pAVar13->mLocation = RVar9;
              *(float *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                   (pAVar18->mConstInitialiser).floatVal;
            }
          }
          goto LAB_008727bf;
        }
        if (OVar3 == knopCall) {
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            name = (AsmJsFunc *)0x3ba;
            bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                         ,0x3ba,"((0))","UNREACHED");
LAB_00872998:
            if (bVar21 == false) {
LAB_00872c39:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar10 = 0;
            goto LAB_008727bf;
          }
          name = (AsmJsFunc *)0x3;
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
          (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
          RVar9 = AsmJsFunc::AcquireRegister<float>(func);
          pAVar13->mLocation = RVar9;
          pPVar16 = ParseNode::AsParseNodeCall(this_00);
          if (pPVar16->pnodeArgs->nop == knopInt) {
            pPVar16 = ParseNode::AsParseNodeCall(this_00);
            pPVar14 = ParseNode::AsParseNodeInt(pPVar16->pnodeArgs);
            iVar8 = pPVar14->lw;
            *(float *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)iVar8;
            RVar9 = AsmJsFunc::GetConstRegister<float>(func,(float)iVar8);
          }
          else {
            pPVar16 = ParseNode::AsParseNodeCall(this_00);
            bVar21 = ParserWrapper::IsNegativeZero(pPVar16->pnodeArgs);
            if (bVar21) {
              *(undefined4 *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 0x80000000;
              RVar9 = AsmJsFunc::GetConstRegister<float>(func,-0.0);
            }
            else {
              pPVar16 = ParseNode::AsParseNodeCall(this_00);
              if (pPVar16->pnodeArgs->nop != knopFlt) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar10 = 1;
                name = (AsmJsFunc *)0x3b2;
                bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                             ,0x3b2,
                                             "(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt)"
                                             ,
                                             "pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt"
                                            );
                if (!bVar21) goto LAB_00872c39;
                *puVar10 = 0;
              }
              pPVar16 = ParseNode::AsParseNodeCall(this_00);
              pPVar15 = ParseNode::AsParseNodeFloat(pPVar16->pnodeArgs);
              dVar1 = pPVar15->dbl;
              *(float *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)dVar1;
              RVar9 = AsmJsFunc::GetConstRegister<float>(func,(float)dVar1);
            }
          }
          goto LAB_008727b5;
        }
        if (OVar3 != knopFlt) goto LAB_008727c3;
        pPVar15 = ParseNode::AsParseNodeFloat(this_00);
        if ((pPVar15->field_0x18 & 1) == 0) {
          name = (AsmJsFunc *)0x2;
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
          (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
          RVar9 = AsmJsFunc::AcquireRegister<double>(func);
          pAVar13->mLocation = RVar9;
          pPVar15 = ParseNode::AsParseNodeFloat(this_00);
          RVar9 = AsmJsFunc::GetConstRegister<double>(func,pPVar15->dbl);
          pPVar15 = ParseNode::AsParseNodeFloat(this_00);
          pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (_func_int **)pPVar15->dbl;
          goto LAB_008727b5;
        }
        pcVar20 = L"Var declaration with integer literal outside range [-2^31, 2^32)";
        goto LAB_00872be5;
      }
      AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
      (pAVar13->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
      RVar9 = AsmJsFunc::AcquireRegister<int>(func);
      pAVar13->mLocation = RVar9;
      pPVar14 = ParseNode::AsParseNodeInt(this_00);
      *(int32 *)&pAVar13[1].super_AsmJsSymbol._vptr_AsmJsSymbol = pPVar14->lw;
      pPVar14 = ParseNode::AsParseNodeInt(this_00);
      name = (AsmJsFunc *)(ulong)(uint)pPVar14->lw;
LAB_008727a9:
      RVar9 = AsmJsFunc::GetConstRegister<int>(func,(int)name);
LAB_008727b5:
      if (RVar9 == 0xffffffff) {
LAB_008727bf:
        OVar3 = this_00->nop;
LAB_008727c3:
        if (OVar3 != knopName) {
          pcVar20 = L"Cannot find Register constant for var";
LAB_00872be5:
          Fail(this,(ParseNode *)name,pcVar20);
LAB_00872c12:
          bVar21 = false;
          goto LAB_00872c15;
        }
      }
    }
    pPVar19 = ParserWrapper::GetBinaryRight(node);
    bVar21 = true;
    if (pPVar19->nop == knopEndCode) break;
  }
LAB_00872c15:
  BVSparse<Memory::ArenaAllocator>::~BVSparse((BVSparse<Memory::ArenaAllocator> *)auStack_88);
  return bVar21;
}

Assistant:

bool AsmJsModuleCompiler::SetupLocalVariables(AsmJsFunc * func)
    {
        ParseNodePtr pnode = func->GetBodyNode();
        MathBuiltin mathBuiltin;
        // define all variables
        BVSparse<ArenaAllocator> initializerBV(&mAllocator);
        while (pnode->nop == knopList)
        {
            ParseNode * varNode = ParserWrapper::GetBinaryLeft(pnode);
            while (varNode && varNode->nop != knopEndCode)
            {
                ParseNode * decl;
                if (varNode->nop == knopList)
                {
                    decl = ParserWrapper::GetBinaryLeft(varNode);
                    varNode = ParserWrapper::GetBinaryRight(varNode);
                }
                else
                {
                    decl = varNode;
                    varNode = nullptr;
                }
                // if we have hit a non-declaration, we are done processing the function header
                if (decl->nop != knopVarDecl)
                {
                    return true;
                }
                ParseNode* pnodeInit = decl->AsParseNodeVar()->pnodeInit;
                AsmJsSymbol * declSym = nullptr;

                bool isFroundInit = false;
                if (!pnodeInit)
                {
                    return Fail(decl, _u("The righthand side of a var declaration missing an initialization (empty)"));
                }

                if (pnodeInit->nop == knopName)
                {
                    declSym = LookupIdentifier(pnodeInit->name(), func);
                    if ((!AsmJsVar::Is(declSym) && !AsmJsMathConst::Is(declSym)) || declSym->isMutable())
                    {
                        return Fail(decl, _u("Var declaration with non-constant"));
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (pnodeInit->AsParseNodeCall()->pnodeTarget->nop != knopName)
                    {
                        return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                    }
                    AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(pnodeInit->AsParseNodeCall()->pnodeTarget->name());

                    if (!funcDecl)
                        return Fail(pnodeInit, _u("Cannot resolve function name"));

                    if (AsmJsMathFunction::Is(funcDecl))
                    {
                        if (!AsmJsMathFunction::IsFround(funcDecl) || !ParserWrapper::IsFroundNumericLiteral(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                        }
                        isFroundInit = true;
                    }
                    else
                    {
                        return Fail(varNode, _u("Unknown function call on var declaration"));
                    }
                }
                else if (pnodeInit->nop != knopInt && pnodeInit->nop != knopFlt)
                {
                    return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                }
                if (!AsmJSCompiler::CheckIdentifier(*this, decl, decl->name()))
                {
                    // CheckIdentifier will print failure message
                    return false;
                }

                AsmJsVar* var = (AsmJsVar*)func->DefineVar(decl->name(), false);
                if (!var)
                {
                    return Fail(decl, _u("Failed to define var"));
                }
                // If we are declaring a var that we previously used in an initializer, that value will be undefined
                // so we need to throw an error.
                if (initializerBV.Test(var->GetName()->GetPropertyId()))
                {
                    return Fail(decl, _u("Cannot declare a var after using it in an initializer"));
                }
                RegSlot loc = Constants::NoRegister;
                if (pnodeInit->nop == knopInt)
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(pnodeInit->AsParseNodeInt()->lw);
                    loc = func->GetConstRegister<int>(pnodeInit->AsParseNodeInt()->lw);
                }
                else if (ParserWrapper::IsMinInt(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(INT_MIN);
                    loc = func->GetConstRegister<int>(INT_MIN);
                }
                else if (ParserWrapper::IsUnsigned(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser((int)((uint32)pnodeInit->AsParseNodeFloat()->dbl));
                    loc = func->GetConstRegister<int>((uint32)pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopFlt)
                {
                    if (pnodeInit->AsParseNodeFloat()->maybeInt)
                    {
                        return Fail(decl, _u("Var declaration with integer literal outside range [-2^31, 2^32)"));
                    }
                    var->SetVarType(AsmJsVarType::Double);
                    var->SetLocation(func->AcquireRegister<double>());
                    loc = func->GetConstRegister<double>(pnodeInit->AsParseNodeFloat()->dbl);
                    var->SetConstInitialiser(pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopName)
                {
                    if (AsmJsVar::Is(declSym))
                    {
                        AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                        initializerBV.Set(definition->GetName()->GetPropertyId());
                        switch (definition->GetVarType().which())
                        {
                        case AsmJsVarType::Double:
                            var->SetVarType(AsmJsVarType::Double);
                            var->SetLocation(func->AcquireRegister<double>());
                            var->SetConstInitialiser(definition->GetDoubleInitialiser());
                            break;

                        case AsmJsVarType::Float:
                            var->SetVarType(AsmJsVarType::Float);
                            var->SetLocation(func->AcquireRegister<float>());
                            var->SetConstInitialiser(definition->GetFloatInitialiser());
                            break;

                        case AsmJsVarType::Int:
                            var->SetVarType(AsmJsVarType::Int);
                            var->SetLocation(func->AcquireRegister<int>());
                            var->SetConstInitialiser(definition->GetIntInitialiser());
                            break;

                        default:
                            Assume(UNREACHED);
                        }
                    }
                    else
                    {
                        Assert(declSym->GetType() == AsmJsType::Double);

                        AsmJsMathConst * definition = AsmJsMathConst::FromSymbol(declSym);

                        var->SetVarType(AsmJsVarType::Double);
                        var->SetLocation(func->AcquireRegister<double>());
                        var->SetConstInitialiser(*definition->GetVal());
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (isFroundInit)
                    {
                        var->SetVarType(AsmJsVarType::Float);
                        var->SetLocation(func->AcquireRegister<float>());
                        if (pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopInt)
                        {
                            int iVal = pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeInt()->lw;
                            var->SetConstInitialiser((float)iVal);
                            loc = func->GetConstRegister<float>((float)iVal);
                        }
                        else if (ParserWrapper::IsNegativeZero(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            var->SetConstInitialiser(-0.0f);
                            loc = func->GetConstRegister<float>(-0.0f);
                        }
                        else
                        {
                            // note: fround((-)NumericLiteral) is explicitly allowed for any range, so we do not need to check for maybeInt
                            Assert(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt);
                            float fVal = (float)pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeFloat()->dbl;
                            var->SetConstInitialiser((float)fVal);
                            loc = func->GetConstRegister<float>(fVal);
                        }
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }
                }

                if (loc == Constants::NoRegister && pnodeInit->nop != knopName)
                {
                    return Fail(decl, _u("Cannot find Register constant for var"));
                }
            }

            if (ParserWrapper::GetBinaryRight(pnode)->nop == knopEndCode)
            {
                break;
            }
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }
        return true;
    }